

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::Signal_PDU::operator==(Signal_PDU *this,Signal_PDU *Value)

{
  pointer __s1;
  pointer pcVar1;
  pointer __s2;
  KBOOL KVar2;
  int iVar3;
  size_t __n;
  
  KVar2 = Radio_Communications_Header::operator!=
                    (&this->super_Radio_Communications_Header,
                     &Value->super_Radio_Communications_Header);
  if ((((!KVar2) &&
       (KVar2 = DATA_TYPE::EncodingScheme::operator!=
                          (&this->m_EncodingScheme,&Value->m_EncodingScheme), !KVar2)) &&
      (this->m_ui32SampleRate == Value->m_ui32SampleRate)) &&
     ((this->m_ui16DataLength == Value->m_ui16DataLength &&
      (this->m_ui16Samples == Value->m_ui16Samples)))) {
    __s1 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
    pcVar1 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)pcVar1 - (long)__s1;
    __s2 = (Value->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
    if (__n == (long)(Value->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
      if (pcVar1 != __s1) {
        iVar3 = bcmp(__s1,__s2,__n);
        return iVar3 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

KBOOL Signal_PDU::operator == ( const Signal_PDU & Value ) const
{
    if( Radio_Communications_Header::operator !=( Value ) )               return false;
    if( m_EncodingScheme                      != Value.m_EncodingScheme ) return false;
    if( m_ui32SampleRate                      != Value.m_ui32SampleRate ) return false;
    if( m_ui16DataLength                      != Value.m_ui16DataLength ) return false;
    if( m_ui16Samples                         != Value.m_ui16Samples )    return false;
    if( m_vData                               != Value.m_vData )          return false;
    return true;
}